

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O0

void ImGui_ImplSDL2_CloseGamepads(void)

{
  ImGui_ImplSDL2_Data *pIVar1;
  SDL_GameController *gamepad;
  _SDL_GameController **__end2;
  _SDL_GameController **__begin2;
  ImVector<_SDL_GameController_*> *__range2;
  ImGui_ImplSDL2_Data *bd;
  _SDL_GameController *in_stack_ffffffffffffffd8;
  int new_size;
  ImVector<_SDL_GameController_*> *in_stack_ffffffffffffffe0;
  ImVector<_SDL_GameController_*> *local_18;
  
  new_size = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  pIVar1 = ImGui_ImplSDL2_GetBackendData();
  if (pIVar1->GamepadMode != ImGui_ImplSDL2_GamepadMode_Manual) {
    local_18 = (ImVector<_SDL_GameController_*> *)
               ImVector<_SDL_GameController_*>::begin(&pIVar1->Gamepads);
    in_stack_ffffffffffffffe0 =
         (ImVector<_SDL_GameController_*> *)ImVector<_SDL_GameController_*>::end(&pIVar1->Gamepads);
    for (; new_size = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
        local_18 != in_stack_ffffffffffffffe0;
        local_18 = (ImVector<_SDL_GameController_*> *)&local_18->Data) {
      in_stack_ffffffffffffffd8 = *(_SDL_GameController **)local_18;
      SDL_GameControllerClose(in_stack_ffffffffffffffd8);
    }
  }
  ImVector<_SDL_GameController_*>::resize(in_stack_ffffffffffffffe0,new_size);
  return;
}

Assistant:

static void ImGui_ImplSDL2_CloseGamepads()
{
    ImGui_ImplSDL2_Data* bd = ImGui_ImplSDL2_GetBackendData();
    if (bd->GamepadMode != ImGui_ImplSDL2_GamepadMode_Manual)
        for (SDL_GameController* gamepad : bd->Gamepads)
            SDL_GameControllerClose(gamepad);
    bd->Gamepads.resize(0);
}